

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O0

void __thiscall
StreamSummary<4U>::Add_Bucket(StreamSummary<4U> *this,StreamBucket *prev,StreamCounter *counter)

{
  Node<int> *pNVar1;
  StreamSummary<4U> *this_00;
  Node<int> *in_RSI;
  StreamBucket *add;
  StreamBucket *temp;
  undefined4 in_stack_ffffffffffffff98;
  count_type in_stack_ffffffffffffff9c;
  StreamSummary<4U> *in_stack_ffffffffffffffa0;
  
  if (in_RSI->next == (Node<int> *)0x0) {
    pNVar1 = (Node<int> *)operator_new(0x20);
    StreamBucket::StreamBucket((StreamBucket *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    Node<int>::Connect(in_RSI,in_RSI,pNVar1);
  }
  else if (1 < in_RSI->next->ID - in_RSI->ID) {
    pNVar1 = in_RSI->next;
    this_00 = (StreamSummary<4U> *)operator_new(0x20);
    StreamBucket::StreamBucket((StreamBucket *)this_00,in_stack_ffffffffffffff9c);
    in_stack_ffffffffffffffa0 = this_00;
    Node<int>::Connect(in_RSI,in_RSI,(Node<int> *)this_00);
    Node<int>::Connect((Node<int> *)this_00,(Node<int> *)this_00,pNVar1);
  }
  Counter2Bucket(in_stack_ffffffffffffffa0,
                 (StreamCounter *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (StreamBucket *)0x117313);
  return;
}

Assistant:

void Add_Bucket(StreamBucket* prev, StreamCounter* counter) {
		if (prev->next == NULL) {
			prev->Connect(prev, new StreamBucket(prev->ID + 1));
		}
		else if (prev->next->ID - prev->ID > 1) {
			StreamBucket* temp = (StreamBucket*)prev->next;
			StreamBucket* add = new StreamBucket(prev->ID + 1);
			prev->Connect(prev, add);
			add->Connect(add, temp);
		}

		Counter2Bucket(counter, (StreamBucket*)prev->next);
	}